

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::core::Transaction::GetSchnorrSignatureHash
          (ByteData256 *__return_storage_ptr__,Transaction *this,uint32_t txin_index,
          SigHashType *sighash_type,
          vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *utxo_list,
          TapScriptData *script_data,ByteData *annex)

{
  AbstractTxOut *pAVar1;
  void *pvVar2;
  SigHashType *this_00;
  bool bVar3;
  uint8_t uVar4;
  bool bVar5;
  WitnessVersion WVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  SigHashAlgorithm SVar9;
  ulong uVar10;
  undefined7 extraout_var;
  int64_t iVar11;
  CfdException *pCVar12;
  long lVar13;
  int iVar14;
  AbstractTxOut *this_01;
  pointer pTVar15;
  long lVar16;
  Amount AVar17;
  Serializer prevouts_buf;
  Serializer amounts_buf;
  Serializer builder;
  ByteData256 top;
  Script locking_script;
  Serializer sequences_buf;
  Serializer scripts_buf;
  undefined1 local_1e8 [8];
  int local_1e0;
  undefined4 uStack_1dc;
  char *local_1d8 [5];
  Transaction *local_1b0;
  ByteData local_1a8;
  Serializer local_190;
  uint32_t local_164;
  Serializer local_160;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> *local_138;
  Serializer local_130;
  int local_104;
  long local_100;
  TapScriptData *local_f8;
  SigHashType *local_f0;
  ulong local_e8;
  ByteData256 local_e0;
  Script local_c8;
  ByteData256 *local_90;
  ulong local_88;
  Serializer local_80;
  Serializer local_58;
  
  local_164 = txin_index;
  local_f8 = script_data;
  local_f0 = sighash_type;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xb])
            (this,(ulong)txin_index,0x32e,"GetSchnorrSignatureHash");
  uVar10 = ((long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7;
  lVar13 = (long)(utxo_list->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(utxo_list->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  local_1b0 = this;
  local_138 = utxo_list;
  if ((ulong)(lVar13 * -0x3333333333333333) <= uVar10 && uVar10 + lVar13 * 0x3333333333333333 != 0)
  {
    local_c8._vptr_Script = (_func_int **)0x62240e;
    local_c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x330;
    local_c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)&local_c8,kCfdLogLevelWarning,"not enough utxo list.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c8._vptr_Script =
         (_func_int **)
         &local_c8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"not enough utxo list.","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&local_c8);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar3 = ByteData::IsEmpty(annex);
  if ((!bVar3) && (uVar4 = ByteData::GetHeadData(annex), uVar4 != 'P')) {
    local_c8._vptr_Script = (_func_int **)0x62240e;
    local_c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x334;
    local_c8.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)&local_c8,kCfdLogLevelWarning,"invalid annex tag.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c8._vptr_Script =
         (_func_int **)
         &local_c8.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"invalid annex tag","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)&local_c8);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_88 = (ulong)local_164;
  local_100 = local_88 * 0x50;
  AbstractTxOut::GetLockingScript
            (&local_c8,
             &(local_138->super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
              _M_impl.super__Vector_impl_data._M_start[local_88].super_AbstractTxOut);
  bVar3 = Script::IsWitnessProgram(&local_c8);
  if (!bVar3) {
    local_1e8 = (undefined1  [8])0x62240e;
    local_1e0 = 0x33a;
    local_1d8[0] = "GetSchnorrSignatureHash";
    logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,"target vin is not segwit.");
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1e8 = (undefined1  [8])local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,"target vin is not segwit.","");
    CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e8);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar6 = Script::GetWitnessVersion(&local_c8);
  this_00 = local_f0;
  if (WVar6 == kVersion1) {
    uVar7 = SigHashType::GetSigHashFlag(local_f0);
    bVar3 = SigHashType::IsAnyoneCanPay(this_00);
    bVar5 = SchnorrSignature::IsValidSigHashType((uint8_t)uVar7);
    if (!bVar5) {
      local_1e8 = (undefined1  [8])0x62240e;
      local_1e0 = 0x346;
      local_1d8[0] = "GetSchnorrSignatureHash";
      logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,
                    "Invalid sighash type on segwit v1.");
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_1e8 = (undefined1  [8])local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Invalid sighash type on segwit v1.","");
      CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e8);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_f8 == (TapScriptData *)0x0) {
      local_e8 = 0;
      iVar14 = 0;
    }
    else {
      bVar5 = ByteData256::IsEmpty(&local_f8->tap_leaf_hash);
      local_e8 = CONCAT71(extraout_var,bVar5) ^ 1;
      iVar14 = (int)local_e8 * 2;
    }
    Serializer::Serializer(&local_130);
    local_1e8 = (undefined1  [8])local_1d8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"TapSighash","");
    HashUtil::Sha256(&local_e0,(string *)local_1e8);
    if (local_1e8 != (undefined1  [8])local_1d8) {
      operator_delete((void *)local_1e8,(ulong)((long)local_1d8[0] + 1));
    }
    Serializer::AddDirectBytes(&local_130,&local_e0);
    Serializer::AddDirectBytes(&local_130,&local_e0);
    Serializer::AddDirectByte(&local_130,'\0');
    uVar8 = SigHashType::GetSigHashFlag(local_f0);
    Serializer::AddDirectByte(&local_130,(uint8_t)uVar8);
    uVar8 = AbstractTransaction::GetVersion(&local_1b0->super_AbstractTransaction);
    Serializer::AddDirectNumber(&local_130,uVar8);
    uVar8 = AbstractTransaction::GetLockTime(&local_1b0->super_AbstractTransaction);
    Serializer::AddDirectNumber(&local_130,uVar8);
    local_104 = iVar14;
    if (!bVar3) {
      Serializer::Serializer(&local_190);
      Serializer::Serializer(&local_160);
      Serializer::Serializer(&local_58);
      local_90 = __return_storage_ptr__;
      Serializer::Serializer(&local_80);
      pTVar15 = (local_1b0->vin_).
                super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((local_1b0->vin_).super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
          _M_impl.super__Vector_impl_data._M_finish != pTVar15) {
        lVar16 = 0;
        lVar13 = 0;
        uVar10 = 0;
        do {
          AbstractTxIn::GetTxid
                    ((Txid *)local_1e8,
                     (AbstractTxIn *)
                     ((long)&(pTVar15->super_AbstractTxIn)._vptr_AbstractTxIn + lVar13));
          Txid::GetData(&local_1a8,(Txid *)local_1e8);
          Serializer::AddDirectBytes(&local_190,&local_1a8);
          if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a8.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          local_1e8 = (undefined1  [8])&PTR__Txid_0087c9b8;
          pvVar2 = (void *)CONCAT44(uStack_1dc,local_1e0);
          if (pvVar2 != (void *)0x0) {
            operator_delete(pvVar2,(long)local_1d8[1] - (long)pvVar2);
          }
          uVar8 = AbstractTxIn::GetVout
                            ((AbstractTxIn *)
                             ((long)&(((local_1b0->vin_).
                                       super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_AbstractTxIn)._vptr_AbstractTxIn + lVar13));
          Serializer::AddDirectNumber(&local_190,uVar8);
          AVar17 = AbstractTxOut::GetValue
                             ((AbstractTxOut *)
                              ((long)&(((local_138->
                                        super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super_AbstractTxOut)._vptr_AbstractTxOut + lVar16));
          local_1e8 = (undefined1  [8])AVar17.amount_;
          local_1e0 = CONCAT31(local_1e0._1_3_,AVar17.ignore_check_);
          iVar11 = Amount::GetSatoshiValue((Amount *)local_1e8);
          Serializer::AddDirectNumber(&local_160,iVar11);
          AbstractTxOut::GetLockingScript
                    ((Script *)local_1e8,
                     (AbstractTxOut *)
                     ((long)&(((local_138->
                               super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                               )._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                             _vptr_AbstractTxOut + lVar16));
          Script::GetData(&local_1a8,(Script *)local_1e8);
          Serializer::AddVariableBuffer(&local_58,&local_1a8);
          if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a8.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8.data_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          Script::~Script((Script *)local_1e8);
          uVar8 = AbstractTxIn::GetSequence
                            ((AbstractTxIn *)
                             ((long)&(((local_1b0->vin_).
                                       super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_AbstractTxIn)._vptr_AbstractTxIn + lVar13));
          Serializer::AddDirectNumber(&local_80,uVar8);
          uVar10 = uVar10 + 1;
          pTVar15 = (local_1b0->vin_).
                    super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar13 = lVar13 + 0x90;
          lVar16 = lVar16 + 0x50;
        } while (uVar10 < (ulong)(((long)(local_1b0->vin_).
                                         super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar15
                                  >> 4) * -0x71c71c71c71c71c7));
      }
      Serializer::Output(&local_1a8,&local_190);
      HashUtil::Sha256((ByteData256 *)local_1e8,&local_1a8);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      __return_storage_ptr__ = local_90;
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a8,&local_160);
      HashUtil::Sha256((ByteData256 *)local_1e8,&local_1a8);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a8,&local_58);
      HashUtil::Sha256((ByteData256 *)local_1e8,&local_1a8);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      Serializer::Output(&local_1a8,&local_80);
      HashUtil::Sha256((ByteData256 *)local_1e8,&local_1a8);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_1a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1a8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_80._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_80.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_80.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_80.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_58._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_58.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_58.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_160._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_160.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_160.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_160.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_160.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_190._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_190.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    iVar14 = local_104;
    if ((uint8_t)uVar7 == '\0' || (uVar7 & 0xf) == 1) {
      Serializer::Serializer(&local_190);
      this_01 = &((local_1b0->vout_).
                  super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                  super__Vector_impl_data._M_start)->super_AbstractTxOut;
      pAVar1 = &((local_1b0->vout_).
                 super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish)->super_AbstractTxOut;
      if (this_01 != pAVar1) {
        do {
          AVar17 = AbstractTxOut::GetValue(this_01);
          local_1e8 = (undefined1  [8])AVar17.amount_;
          local_1e0 = CONCAT31(local_1e0._1_3_,AVar17.ignore_check_);
          iVar11 = Amount::GetSatoshiValue((Amount *)local_1e8);
          Serializer::AddDirectNumber(&local_190,iVar11);
          AbstractTxOut::GetLockingScript((Script *)local_1e8,this_01);
          Script::GetData((ByteData *)&local_160,(Script *)local_1e8);
          Serializer::AddVariableBuffer(&local_190,(ByteData *)&local_160);
          if (local_160._vptr_Serializer != (_func_int **)0x0) {
            operator_delete(local_160._vptr_Serializer,
                            (long)local_160.buffer_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_160._vptr_Serializer);
          }
          Script::~Script((Script *)local_1e8);
          this_01 = this_01 + 1;
        } while (this_01 != pAVar1);
      }
      Serializer::Output((ByteData *)&local_160,&local_190);
      HashUtil::Sha256((ByteData256 *)local_1e8,(ByteData *)&local_160);
      iVar14 = local_104;
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_160._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_160._vptr_Serializer,
                        (long)local_160.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_160._vptr_Serializer);
      }
      local_190._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_190.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    bVar5 = ByteData::IsEmpty(annex);
    Serializer::AddDirectByte(&local_130,(byte)iVar14 | !bVar5);
    uVar10 = local_88;
    uVar7 = local_164;
    if (bVar3) {
      AbstractTxIn::GetTxid
                ((Txid *)local_1e8,
                 &(local_1b0->vin_).
                  super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
                  super__Vector_impl_data._M_start[local_88].super_AbstractTxIn);
      Txid::GetData((ByteData *)&local_190,(Txid *)local_1e8);
      Serializer::AddDirectBytes(&local_130,(ByteData *)&local_190);
      if (local_190._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_190._vptr_Serializer,
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_190._vptr_Serializer);
      }
      local_1e8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT44(uStack_1dc,local_1e0);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_1d8[1] - (long)pvVar2);
      }
      uVar7 = AbstractTxIn::GetVout
                        (&(local_1b0->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxIn);
      Serializer::AddDirectNumber(&local_130,uVar7);
      AVar17 = AbstractTxOut::GetValue
                         ((AbstractTxOut *)
                          ((long)&(((local_138->
                                    super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut
                                  )._vptr_AbstractTxOut + local_100));
      local_1e8 = (undefined1  [8])AVar17.amount_;
      local_1e0 = CONCAT31(local_1e0._1_3_,AVar17.ignore_check_);
      iVar11 = Amount::GetSatoshiValue((Amount *)local_1e8);
      Serializer::AddDirectNumber(&local_130,iVar11);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e8,
                 (AbstractTxOut *)
                 ((long)&(((local_138->
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>).
                           _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                         _vptr_AbstractTxOut + local_100));
      Script::GetData((ByteData *)&local_190,(Script *)local_1e8);
      Serializer::AddVariableBuffer(&local_130,(ByteData *)&local_190);
      if (local_190._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_190._vptr_Serializer,
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_190._vptr_Serializer);
      }
      Script::~Script((Script *)local_1e8);
      uVar7 = AbstractTxIn::GetSequence
                        (&(local_1b0->vin_).
                          super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar10].super_AbstractTxIn);
    }
    Serializer::AddDirectNumber(&local_130,uVar7);
    bVar3 = ByteData::IsEmpty(annex);
    if (!bVar3) {
      HashUtil::Sha256((ByteData256 *)local_1e8,annex);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
    }
    SVar9 = SigHashType::GetSigHashAlgorithm(local_f0);
    if (SVar9 == kSigHashSingle) {
      (*(local_1b0->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
                (local_1b0,(ulong)local_164,0x38b,"GetSchnorrSignatureHash");
      Serializer::Serializer(&local_190);
      AVar17 = AbstractTxOut::GetValue
                         ((AbstractTxOut *)
                          ((long)&(((local_1b0->vout_).
                                    super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut)
                                  ._vptr_AbstractTxOut + local_100));
      local_1e8 = (undefined1  [8])AVar17.amount_;
      local_1e0 = CONCAT31(local_1e0._1_3_,AVar17.ignore_check_);
      iVar11 = Amount::GetSatoshiValue((Amount *)local_1e8);
      Serializer::AddDirectNumber(&local_190,iVar11);
      AbstractTxOut::GetLockingScript
                ((Script *)local_1e8,
                 (AbstractTxOut *)
                 ((long)&(((local_1b0->vout_).
                           super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOut).
                         _vptr_AbstractTxOut + local_100));
      Script::GetData((ByteData *)&local_160,(Script *)local_1e8);
      Serializer::AddVariableBuffer(&local_190,(ByteData *)&local_160);
      if (local_160._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_160._vptr_Serializer,
                        (long)local_160.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_160._vptr_Serializer);
      }
      Script::~Script((Script *)local_1e8);
      Serializer::Output((ByteData *)&local_160,&local_190);
      HashUtil::Sha256((ByteData256 *)local_1e8,(ByteData *)&local_160);
      Serializer::AddDirectBytes(&local_130,(ByteData256 *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      if (local_160._vptr_Serializer != (_func_int **)0x0) {
        operator_delete(local_160._vptr_Serializer,
                        (long)local_160.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_160._vptr_Serializer);
      }
      local_190._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
      if (local_190.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_190.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_190.buffer_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((char)local_e8 != '\0') {
      ByteData256::GetData((ByteData *)local_1e8,&local_f8->tap_leaf_hash);
      Serializer::AddDirectBytes(&local_130,(ByteData *)local_1e8);
      if (local_1e8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
      }
      Serializer::AddDirectByte(&local_130,'\0');
      Serializer::AddDirectNumber(&local_130,local_f8->code_separator_position);
    }
    Serializer::Output((ByteData *)local_1e8,&local_130);
    HashUtil::Sha256(__return_storage_ptr__,(ByteData *)local_1e8);
    if (local_1e8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1e8,(long)local_1d8[0] - (long)local_1e8);
    }
    if (local_e0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e0.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_e0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e0.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_130._vptr_Serializer = (_func_int **)&PTR__Serializer_00887f98;
    if (local_130.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_130.buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    Script::~Script(&local_c8);
    return __return_storage_ptr__;
  }
  local_1e8 = (undefined1  [8])0x62240e;
  local_1e0 = 0x33d;
  local_1d8[0] = "GetSchnorrSignatureHash";
  logger::log<>((CfdSourceLocation *)local_1e8,kCfdLogLevelWarning,"target vin is not segwit v1.");
  pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1e8 = (undefined1  [8])local_1d8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"target vin is not segwit v1.","");
  CfdException::CfdException(pCVar12,kCfdIllegalArgumentError,(string *)local_1e8);
  __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 Transaction::GetSchnorrSignatureHash(
    uint32_t txin_index, SigHashType sighash_type,
    const std::vector<TxOut> &utxo_list, const TapScriptData *script_data,
    const ByteData &annex) const {
  CheckTxInIndex(txin_index, __LINE__, __FUNCTION__);
  if (this->vin_.size() > utxo_list.size()) {
    warn(CFD_LOG_SOURCE, "not enough utxo list.");
    throw CfdException(kCfdIllegalArgumentError, "not enough utxo list.");
  }
  if ((!annex.IsEmpty()) && (annex.GetHeadData() != TaprootUtil::kAnnexTag)) {
    warn(CFD_LOG_SOURCE, "invalid annex tag.");
    throw CfdException(kCfdIllegalArgumentError, "invalid annex tag");
  }

  const Script locking_script = utxo_list[txin_index].GetLockingScript();
  if (!locking_script.IsWitnessProgram()) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit.");
    throw CfdException(kCfdIllegalArgumentError, "target vin is not segwit.");
  } else if (locking_script.GetWitnessVersion() != WitnessVersion::kVersion1) {
    warn(CFD_LOG_SOURCE, "target vin is not segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "target vin is not segwit v1.");
  }

  uint8_t sighash_type_value =
      static_cast<uint8_t>(sighash_type.GetSigHashFlag());
  bool is_anyone_can_pay = sighash_type.IsAnyoneCanPay();
  if (!SchnorrSignature::IsValidSigHashType(sighash_type_value)) {
    warn(CFD_LOG_SOURCE, "Invalid sighash type on segwit v1.");
    throw CfdException(
        kCfdIllegalArgumentError, "Invalid sighash type on segwit v1.");
  } else if (sighash_type_value == 0) {
    sighash_type_value = 0x01;  // SIGHASH_ALL
  }
  bool has_sighash_all = ((sighash_type_value & 0x0f) == 1) ? true : false;

  uint8_t ext_flag = 0;  // 0 - 127
  uint8_t has_tap_script = 0;
  uint8_t key_version = 0;
  if ((script_data != nullptr) && (!script_data->tap_leaf_hash.IsEmpty())) {
    has_tap_script = 1;
  }
  ext_flag |= has_tap_script;

  Serializer builder;
  auto top = HashUtil::Sha256("TapSighash");
  builder.AddDirectBytes(top);
  builder.AddDirectBytes(top);  // double data
  builder.AddDirectByte(0);     // EPOCH
  builder.AddDirectByte(static_cast<uint8_t>(sighash_type.GetSigHashFlag()));
  builder.AddDirectNumber(static_cast<uint32_t>(GetVersion()));
  builder.AddDirectNumber(GetLockTime());
  if (!is_anyone_can_pay) {
    Serializer prevouts_buf;
    Serializer amounts_buf;
    Serializer scripts_buf;
    Serializer sequences_buf;
    for (size_t index = 0; index < vin_.size(); ++index) {
      prevouts_buf.AddDirectBytes(vin_[index].GetTxid().GetData());
      prevouts_buf.AddDirectNumber(vin_[index].GetVout());
      amounts_buf.AddDirectNumber(
          utxo_list[index].GetValue().GetSatoshiValue());
      scripts_buf.AddVariableBuffer(
          utxo_list[index].GetLockingScript().GetData());
      sequences_buf.AddDirectNumber(vin_[index].GetSequence());
    }
    builder.AddDirectBytes(HashUtil::Sha256(prevouts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(amounts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(scripts_buf.Output()));
    builder.AddDirectBytes(HashUtil::Sha256(sequences_buf.Output()));
  }
  if (has_sighash_all) {
    Serializer outputs_buf;
    for (const auto &txout : vout_) {
      outputs_buf.AddDirectNumber(txout.GetValue().GetSatoshiValue());
      outputs_buf.AddVariableBuffer(txout.GetLockingScript().GetData());
    }
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  uint8_t spend_type = (ext_flag << 1) + (annex.IsEmpty() ? 0 : 1);
  builder.AddDirectByte(spend_type);
  if (is_anyone_can_pay) {
    builder.AddDirectBytes(vin_[txin_index].GetTxid().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetVout());
    builder.AddDirectNumber(
        utxo_list[txin_index].GetValue().GetSatoshiValue());
    builder.AddVariableBuffer(
        utxo_list[txin_index].GetLockingScript().GetData());
    builder.AddDirectNumber(vin_[txin_index].GetSequence());
  } else {
    builder.AddDirectNumber(txin_index);
  }

  if (!annex.IsEmpty()) builder.AddDirectBytes(HashUtil::Sha256(annex));

  if (sighash_type.GetSigHashAlgorithm() == SigHashAlgorithm::kSigHashSingle) {
    CheckTxOutIndex(txin_index, __LINE__, __FUNCTION__);
    Serializer outputs_buf;
    outputs_buf.AddDirectNumber(
        vout_[txin_index].GetValue().GetSatoshiValue());
    outputs_buf.AddVariableBuffer(
        vout_[txin_index].GetLockingScript().GetData());
    builder.AddDirectBytes(HashUtil::Sha256(outputs_buf.Output()));
  }

  if (has_tap_script == 1) {
    builder.AddDirectBytes(script_data->tap_leaf_hash.GetData());
    builder.AddDirectByte(key_version);
    builder.AddDirectNumber(script_data->code_separator_position);
  }
  return HashUtil::Sha256(builder.Output());
}